

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c14n.c
# Opt level: O0

int xmlC14NProcessNodeList(xmlC14NCtxPtr ctx,xmlNodePtr cur)

{
  int local_24;
  _xmlNode *p_Stack_20;
  int ret;
  xmlNodePtr cur_local;
  xmlC14NCtxPtr ctx_local;
  
  if (ctx == (xmlC14NCtxPtr)0x0) {
    xmlC14NErrParam("processing node list");
    ctx_local._4_4_ = -1;
  }
  else {
    local_24 = 0;
    for (p_Stack_20 = cur; p_Stack_20 != (xmlNodePtr)0x0 && -1 < local_24;
        p_Stack_20 = p_Stack_20->next) {
      local_24 = xmlC14NProcessNode(ctx,p_Stack_20);
    }
    ctx_local._4_4_ = local_24;
  }
  return ctx_local._4_4_;
}

Assistant:

static int
xmlC14NProcessNodeList(xmlC14NCtxPtr ctx, xmlNodePtr cur)
{
    int ret;

    if (ctx == NULL) {
        xmlC14NErrParam("processing node list");
        return (-1);
    }

    for (ret = 0; cur != NULL && ret >= 0; cur = cur->next) {
        ret = xmlC14NProcessNode(ctx, cur);
    }
    return (ret);
}